

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_thread.cxx
# Opt level: O3

int ndiEventWait(pl_cond_and_mutex_t *event,int milliseconds)

{
  pthread_mutex_t *ppVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  timespec ts;
  timespec local_40;
  timeval local_30;
  
  if (milliseconds < 0) {
    ppVar1 = &event->mutex;
    pthread_mutex_lock((pthread_mutex_t *)ppVar1);
    if (event->signalled == 0) {
      pthread_cond_wait((pthread_cond_t *)&event->cond,(pthread_mutex_t *)ppVar1);
    }
    event->signalled = 0;
    pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
    return 0;
  }
  ppVar1 = &event->mutex;
  pthread_mutex_lock((pthread_mutex_t *)ppVar1);
  if (event->signalled == 0) {
    gettimeofday(&local_30,(__timezone_ptr_t)0x0);
    uVar4 = (ulong)(((uint)milliseconds % 1000) * 1000);
    lVar2 = local_30.tv_usec + uVar4;
    local_40.tv_nsec = local_30.tv_usec + -1000000 + uVar4;
    if (lVar2 < 1000000) {
      local_40.tv_nsec = lVar2;
    }
    local_40.tv_sec = (ulong)(999999 < lVar2) + local_30.tv_sec + (ulong)(uint)milliseconds / 1000;
    local_40.tv_nsec = local_40.tv_nsec * 1000;
    iVar3 = pthread_cond_timedwait
                      ((pthread_cond_t *)&event->cond,(pthread_mutex_t *)ppVar1,&local_40);
    iVar5 = 1;
    if (iVar3 == 0x6e) goto LAB_0010be54;
  }
  event->signalled = 0;
  iVar5 = 0;
LAB_0010be54:
  pthread_mutex_unlock((pthread_mutex_t *)ppVar1);
  return iVar5;
}

Assistant:

ndicapiExport int ndiEventWait(pl_cond_and_mutex_t* event, int milliseconds)
{
  int timedout = 0;

  if (milliseconds < 0)   /* do infinite wait */
  {
    pthread_mutex_lock(&event->mutex);
    if (event->signalled == 0)
    {
      pthread_cond_wait(&event->cond, &event->mutex);
    }
    event->signalled = 0;
    pthread_mutex_unlock(&event->mutex);
  }
  else   /* do timed wait */
  {
    struct timeval tv;
    struct timespec ts;

    pthread_mutex_lock(&event->mutex);
    if (event->signalled == 0)
    {
      /* all the time stuff is used to check for timeouts */
      gettimeofday(&tv, 0);
      tv.tv_sec += milliseconds / 1000; /* msec to sec */
      tv.tv_usec += (milliseconds % 1000) * 1000; /* msec to usec */
      if (tv.tv_usec >= 1000000)   /* if usec overflow */
      {
        tv.tv_usec -= 1000000;
        tv.tv_sec += 1;
      }
      /* convert timeval to timespec */
      ts.tv_sec = tv.tv_sec;
      ts.tv_nsec = tv.tv_usec * 1000;

#ifdef PTHREAD_COND_TIMEDWAIT_USES_TIMEVAL
      timedout = (pthread_cond_timedwait(&event->cond, &event->mutex, &tv) == ETIMEDOUT);
#else
      timedout = (pthread_cond_timedwait(&event->cond, &event->mutex, &ts) == ETIMEDOUT);
#endif
    }
    if (!timedout)
    {
      event->signalled = 0;
    }
    pthread_mutex_unlock(&event->mutex);
  }

  return timedout;
}